

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v6::print<char[28],char_const*&,int&,char_const*&,char>
               (FILE *f,char (*format_str) [28],char **args,int *args_1,char **args_2)

{
  size_t sVar1;
  string_view format_str_00;
  format_args args_00;
  char *local_58 [2];
  ulong local_48;
  char *local_38;
  
  sVar1 = strlen(*format_str);
  local_58[0] = *args;
  local_48 = (ulong)(uint)*args_1;
  local_38 = *args_2;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = *format_str;
  args_00.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        *)local_58;
  args_00.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .types_ = 0x344d;
  vprint(f,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  return internal::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str),
                      internal::make_args_checked<Args...>(format_str, args...))
             : internal::vprint_mojibake(
                   f, to_string_view(format_str),
                   internal::make_args_checked<Args...>(format_str, args...));
}